

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::
         ObjectHelper<Assimp::IFC::Schema_2x3::IfcFillAreaStyleTileSymbolWithStyle,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcFillAreaStyleTileSymbolWithStyle *in;
  
  in = (IfcFillAreaStyleTileSymbolWithStyle *)operator_new(0x50);
  *(undefined8 *)&in->field_0x40 = 0;
  *(char **)&in->field_0x48 = "IfcFillAreaStyleTileSymbolWithStyle";
  *(undefined8 *)&(in->super_IfcGeometricRepresentationItem).field_0x28 = 0;
  *(undefined8 *)&(in->super_IfcGeometricRepresentationItem).field_0x30 = 0;
  (in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFillAreaStyleTileSymbolWithStyle_00897088;
  *(undefined ***)&in->field_0x38 = &PTR__IfcFillAreaStyleTileSymbolWithStyle_00897100;
  *(undefined ***)
   &(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFillAreaStyleTileSymbolWithStyle_008970b0;
  *(undefined ***)
   &(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFillAreaStyleTileSymbolWithStyle_008970d8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFillAreaStyleTileSymbolWithStyle>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }